

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

Kernel * anon_unknown.dwarf_18c712::SumKernel::create
                   (string *def,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  pointer pcVar1;
  Kernel *pKVar2;
  value_type local_38;
  
  pKVar2 = (Kernel *)operator_new(0x60);
  pKVar2->_vptr_Kernel = (_func_int **)&PTR_process_00277af0;
  pKVar2[1]._vptr_Kernel = (_func_int **)(pKVar2 + 3);
  pcVar1 = (def->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pKVar2 + 1),pcVar1,pcVar1 + def->_M_string_length);
  pKVar2[5]._vptr_Kernel = (_func_int **)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(pKVar2 + 6),args);
  pKVar2[9]._vptr_Kernel = (_func_int **)0x0;
  pKVar2[10]._vptr_Kernel = (_func_int **)0x0;
  pKVar2[0xb]._vptr_Kernel = (_func_int **)0x0;
  local_38.m_node = (Node *)0x0;
  std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::_M_fill_assign
            ((vector<cali::Attribute,_std::allocator<cali::Attribute>_> *)(pKVar2 + 9),
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,&local_38);
  return pKVar2;
}

Assistant:

static Kernel* create(const std::string& def, const std::vector<std::string>& args)
    {
        return new SumKernel(def, args);
    }